

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trace.cpp
# Opt level: O1

void __thiscall MppTraceService::MppTraceService(MppTraceService *this)

{
  char *__name;
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  
  ppcVar3 = MppTraceService::ftrace_paths;
  uVar2 = 0;
  while( true ) {
    __name = *ppcVar3;
    iVar1 = access(__name,0);
    if (iVar1 == 0) {
      iVar1 = open(__name,0x80001);
      this->mTraceFd = iVar1;
      if (-1 < iVar1) {
        return;
      }
    }
    if (1 < uVar2) break;
    uVar2 = uVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  }
  return;
}

Assistant:

MppTraceService::MppTraceService()
{
    static const char *ftrace_paths[] = {
        "/sys/kernel/debug/tracing/trace_marker",
        "/debug/tracing/trace_marker",
        "/debugfs/tracing/trace_marker",
    };

    RK_U32 i;

    for (i = 0; i < MPP_ARRAY_ELEMS(ftrace_paths); i++) {
        if (!access(ftrace_paths[i], F_OK)) {
            mTraceFd = open(ftrace_paths[i], O_WRONLY | O_CLOEXEC);
            if (mTraceFd >= 0)
                break;
        }
    }
}